

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_invmod(mp_int *a,mp_int *b,mp_int *c)

{
  mp_digit *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  mp_int *b_00;
  mp_int *a_00;
  mp_int C;
  mp_int A;
  mp_int v;
  mp_int u;
  mp_int D;
  mp_int B;
  mp_int y;
  mp_int x;
  mp_int t;
  
  if (b->sign == 1) {
    return -3;
  }
  if (b->used == 0) {
    return -3;
  }
  iVar4 = mp_init_multi(&x,&y,&u,&v,&A,&B,&C,&D,0);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = mp_mod(a,b,&x);
  if ((((iVar4 == 0) && (iVar4 = mp_copy(b,&y), iVar4 == 0)) &&
      ((x.used < 1 || ((((*x.dp & 1) != 0 || (y.used < 1)) || (iVar4 = -3, (*y.dp & 1) != 0)))))) &&
     ((iVar4 = mp_copy(&x,&u), iVar4 == 0 && (iVar4 = mp_copy(&y,&v), iVar4 == 0)))) {
    A.sign = 0;
    A.used = 0;
    if (0 < (long)A.alloc) {
      memset(A.dp,0,(long)A.alloc << 3);
    }
    *A.dp = 1;
    A.used = 1;
    D.sign = 0;
    D.used = 0;
    if (0 < (long)D.alloc) {
      memset(D.dp,0,(long)D.alloc << 3);
    }
    *D.dp = 1;
    D.used = 1;
    do {
      while ((0 < u.used && ((*u.dp & 1) == 0))) {
        iVar4 = mp_div_2(&u,&u);
        if ((iVar4 != 0) ||
           (((((0 < A.used && ((*A.dp & 1) != 0)) || ((0 < B.used && ((*B.dp & 1) != 0)))) &&
             ((iVar4 = mp_add(&A,&y,&A), iVar4 != 0 || (iVar4 = mp_sub(&B,&x,&B), iVar4 != 0)))) ||
            ((iVar4 = mp_div_2(&A,&A), iVar4 != 0 || (iVar4 = mp_div_2(&B,&B), iVar4 != 0))))))
        goto LAB_001064b6;
      }
      while ((0 < v.used && ((*v.dp & 1) == 0))) {
        iVar4 = mp_div_2(&v,&v);
        if ((iVar4 != 0) ||
           (((((0 < C.used && ((*C.dp & 1) != 0)) || ((0 < D.used && ((*D.dp & 1) != 0)))) &&
             ((iVar4 = mp_add(&C,&y,&C), iVar4 != 0 || (iVar4 = mp_sub(&D,&x,&D), iVar4 != 0)))) ||
            ((iVar4 = mp_div_2(&C,&C), iVar4 != 0 || (iVar4 = mp_div_2(&D,&D), iVar4 != 0))))))
        goto LAB_001064b6;
      }
      iVar4 = mp_cmp(&u,&v);
      if (iVar4 == -1) {
        iVar4 = mp_sub(&v,&u,&v);
        if ((iVar4 != 0) || (iVar4 = mp_sub(&C,&A,&C), iVar4 != 0)) goto LAB_001064b6;
        b_00 = &B;
        a_00 = &D;
      }
      else {
        iVar4 = mp_sub(&u,&v,&u);
        if ((iVar4 != 0) || (iVar4 = mp_sub(&A,&C,&A), iVar4 != 0)) goto LAB_001064b6;
        b_00 = &D;
        a_00 = &B;
      }
      iVar4 = mp_sub(a_00,b_00,a_00);
      if (iVar4 != 0) goto LAB_001064b6;
    } while (u.used != 0);
    iVar4 = -3;
    if (((v.sign != 1) && (v.used < 2)) && (*v.dp == 1)) goto LAB_001067c5;
  }
  goto LAB_001064b6;
  while (iVar4 = mp_add(&C,b,&C), iVar4 == 0) {
LAB_001067c5:
    if (C.sign != 1) goto LAB_001067e8;
  }
  goto LAB_001064b6;
  while (iVar4 = mp_sub(&C,b,&C), iVar4 == 0) {
LAB_001067e8:
    iVar4 = mp_cmp_mag(&C,b);
    if (iVar4 == -1) {
      pmVar1 = c->dp;
      uVar2._0_4_ = c->used;
      uVar2._4_4_ = c->alloc;
      uVar3._0_4_ = c->sign;
      uVar3._4_4_ = *(undefined4 *)&c->field_0xc;
      c->used = C.used;
      c->alloc = C.alloc;
      c->sign = C.sign;
      *(undefined4 *)&c->field_0xc = C._12_4_;
      c->dp = C.dp;
      iVar4 = 0;
      C._0_8_ = uVar2;
      C._8_8_ = uVar3;
      C.dp = pmVar1;
      break;
    }
  }
LAB_001064b6:
  mp_clear_multi(&x,&y,&u,&v,&A,&B,&C,&D,0);
  return iVar4;
}

Assistant:

int mp_invmod (mp_int * a, mp_int * b, mp_int * c)
{
  mp_int  x, y, u, v, A, B, C, D;
  int     res;

  /* b cannot be negative */
  if (b->sign == MP_NEG || mp_iszero(b) == 1) {
    return MP_VAL;
  }

  /* init temps */
  if ((res = mp_init_multi(&x, &y, &u, &v, 
                           &A, &B, &C, &D, NULL)) != MP_OKAY) {
     return res;
  }

  /* x = a, y = b */
  if ((res = mp_mod(a, b, &x)) != MP_OKAY) {
      goto LBL_ERR;
  }
  if ((res = mp_copy (b, &y)) != MP_OKAY) {
    goto LBL_ERR;
  }

  /* 2. [modified] if x,y are both even then return an error! */
  if (mp_iseven (&x) == 1 && mp_iseven (&y) == 1) {
    res = MP_VAL;
    goto LBL_ERR;
  }

  /* 3. u=x, v=y, A=1, B=0, C=0,D=1 */
  if ((res = mp_copy (&x, &u)) != MP_OKAY) {
    goto LBL_ERR;
  }
  if ((res = mp_copy (&y, &v)) != MP_OKAY) {
    goto LBL_ERR;
  }
  mp_set (&A, 1);
  mp_set (&D, 1);

top:
  /* 4.  while u is even do */
  while (mp_iseven (&u) == 1) {
    /* 4.1 u = u/2 */
    if ((res = mp_div_2 (&u, &u)) != MP_OKAY) {
      goto LBL_ERR;
    }
    /* 4.2 if A or B is odd then */
    if (mp_isodd (&A) == 1 || mp_isodd (&B) == 1) {
      /* A = (A+y)/2, B = (B-x)/2 */
      if ((res = mp_add (&A, &y, &A)) != MP_OKAY) {
         goto LBL_ERR;
      }
      if ((res = mp_sub (&B, &x, &B)) != MP_OKAY) {
         goto LBL_ERR;
      }
    }
    /* A = A/2, B = B/2 */
    if ((res = mp_div_2 (&A, &A)) != MP_OKAY) {
      goto LBL_ERR;
    }
    if ((res = mp_div_2 (&B, &B)) != MP_OKAY) {
      goto LBL_ERR;
    }
  }

  /* 5.  while v is even do */
  while (mp_iseven (&v) == 1) {
    /* 5.1 v = v/2 */
    if ((res = mp_div_2 (&v, &v)) != MP_OKAY) {
      goto LBL_ERR;
    }
    /* 5.2 if C or D is odd then */
    if (mp_isodd (&C) == 1 || mp_isodd (&D) == 1) {
      /* C = (C+y)/2, D = (D-x)/2 */
      if ((res = mp_add (&C, &y, &C)) != MP_OKAY) {
         goto LBL_ERR;
      }
      if ((res = mp_sub (&D, &x, &D)) != MP_OKAY) {
         goto LBL_ERR;
      }
    }
    /* C = C/2, D = D/2 */
    if ((res = mp_div_2 (&C, &C)) != MP_OKAY) {
      goto LBL_ERR;
    }
    if ((res = mp_div_2 (&D, &D)) != MP_OKAY) {
      goto LBL_ERR;
    }
  }

  /* 6.  if u >= v then */
  if (mp_cmp (&u, &v) != MP_LT) {
    /* u = u - v, A = A - C, B = B - D */
    if ((res = mp_sub (&u, &v, &u)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&A, &C, &A)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&B, &D, &B)) != MP_OKAY) {
      goto LBL_ERR;
    }
  } else {
    /* v - v - u, C = C - A, D = D - B */
    if ((res = mp_sub (&v, &u, &v)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&C, &A, &C)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&D, &B, &D)) != MP_OKAY) {
      goto LBL_ERR;
    }
  }

  /* if not zero goto step 4 */
  if (mp_iszero (&u) == 0)
    goto top;

  /* now a = C, b = D, gcd == g*v */

  /* if v != 1 then there is no inverse */
  if (mp_cmp_d (&v, 1) != MP_EQ) {
    res = MP_VAL;
    goto LBL_ERR;
  }

  /* if its too low */
  while (mp_cmp_d(&C, 0) == MP_LT) {
      if ((res = mp_add(&C, b, &C)) != MP_OKAY) {
         goto LBL_ERR;
      }
  }
  
  /* too big */
  while (mp_cmp_mag(&C, b) != MP_LT) {
      if ((res = mp_sub(&C, b, &C)) != MP_OKAY) {
         goto LBL_ERR;
      }
  }
  
  /* C is now the inverse */
  mp_exch (&C, c);
  res = MP_OKAY;
LBL_ERR:mp_clear_multi (&x, &y, &u, &v, &A, &B, &C, &D, NULL);
  return res;
}